

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_MAP_AREA(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  player_upkeep *ppVar4;
  chunk_conflict *pcVar5;
  _Bool _Var6;
  loc lVar7;
  loc lVar8;
  int iVar9;
  wchar_t wVar10;
  int iVar11;
  wchar_t wVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  source origin;
  
  wVar10 = context->y;
  if (wVar10 == L'\0') {
    wVar10 = (context->value).dice;
  }
  wVar12 = context->x;
  if (wVar12 == L'\0') {
    wVar12 = (context->value).sides;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  lVar7 = origin_get_loc(origin);
  iVar17 = lVar7.x - wVar12;
  iVar13 = wVar12 + lVar7.x;
  iVar15 = lVar7.y - wVar10;
  iVar11 = wVar10 + lVar7.y;
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  if (iVar17 < 1) {
    iVar17 = 0;
  }
  iVar14 = cave->height + -1;
  if (iVar11 < cave->height) {
    iVar14 = iVar11;
  }
  iVar11 = iVar15;
  iVar9 = cave->width + -1;
  if (iVar13 < cave->width) {
    iVar9 = iVar13;
  }
  do {
    iVar13 = iVar17;
    if (iVar14 <= iVar11) {
      for (iVar15 = iVar15 + -1; iVar11 = iVar17 + -1, iVar15 <= iVar14; iVar15 = iVar15 + 1) {
        for (; iVar11 <= iVar9; iVar11 = iVar11 + 1) {
          lVar7 = (loc)loc(iVar11,iVar15);
          _Var6 = square_in_bounds(cave,lVar7);
          if (_Var6) {
            square_unmark(cave,lVar7);
          }
        }
      }
      ppVar4 = player->upkeep;
      uVar1._0_4_ = ppVar4->update;
      uVar1._4_4_ = ppVar4->redraw;
      ppVar4->update = (int)(uVar1 | 0xc1000000000060);
      ppVar4->redraw = (int)((uVar1 | 0xc1000000000060) >> 0x20);
      context->ident = true;
      return true;
    }
    for (; iVar13 < iVar9; iVar13 = iVar13 + 1) {
      lVar7 = (loc)loc(iVar13,iVar11);
      _Var6 = square_isno_map(cave,lVar7);
      if (!_Var6) {
        _Var6 = square_seemslikewall(cave,lVar7);
        if (!_Var6) {
          _Var6 = square_in_bounds_fully(cave,lVar7);
          if (!_Var6) goto LAB_0013bf64;
          _Var6 = square_isfloor(cave,lVar7);
          if (!_Var6) {
            square_memorize(cave,lVar7);
          }
          for (lVar16 = 0; pcVar5 = cave, lVar16 != 8; lVar16 = lVar16 + 1) {
            sVar2 = ddy_ddd[lVar16];
            sVar3 = ddx_ddd[lVar16];
            lVar8 = (loc)loc(sVar3 + iVar13,sVar2 + iVar11);
            _Var6 = square_seemslikewall(pcVar5,lVar8);
            pcVar5 = cave;
            if (_Var6) {
              lVar8 = (loc)loc(sVar3 + iVar13,sVar2 + iVar11);
              square_memorize(pcVar5,lVar8);
            }
          }
        }
        _Var6 = square_ismemorybad(cave,lVar7);
        if (_Var6) {
          square_forget(cave,lVar7);
        }
      }
LAB_0013bf64:
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

bool effect_handler_MAP_AREA(effect_handler_context_t *context)
{
	int i, x, y;
	int x1, x2, y1, y2;
	int dist_y = context->y ? context->y : context->value.dice;
	int dist_x = context->x ? context->x : context->value.sides;
	struct loc centre = origin_get_loc(context->origin);

	/* Pick an area to map */
	y1 = centre.y - dist_y;
	y2 = centre.y + dist_y;
	x1 = centre.x - dist_x;
	x2 = centre.x + dist_x;

	/* Drag the co-ordinates into the dungeon */
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			/* Some squares can't be mapped */
			if (square_isno_map(cave, grid)) continue;

			/* All non-walls are "checked" */
			if (!square_seemslikewall(cave, grid)) {
				if (!square_in_bounds_fully(cave, grid)) continue;

				/* Memorize normal features */
				if (!square_isfloor(cave, grid))
					square_memorize(cave, grid);

				/* Memorize known walls */
				for (i = 0; i < 8; i++) {
					int yy = y + ddy_ddd[i];
					int xx = x + ddx_ddd[i];

					/* Memorize walls (etc) */
					if (square_seemslikewall(cave, loc(xx, yy)))
						square_memorize(cave, loc(xx, yy));
				}
			}

			/*
			 * Forget grids that are both unprocessed and
			 * misremembered in the mapping area.
			 */
			if (square_ismemorybad(cave, grid)) {
				square_forget(cave, grid);
			}
		}
	}

	/* Unmark grids */
	for (y = y1 - 1; y < y2 + 1; y++) {
		for (x = x1 - 1; x < x2 + 1; x++) {
			struct loc grid = loc(x, y);
			if (!square_in_bounds(cave, grid)) continue;
			square_unmark(cave, grid);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw whole map, monster list */
	player->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);

	/* Notice */
	context->ident = true;

	return true;
}